

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> cont)

{
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  size_t sVar2;
  iterator o;
  ulong uVar3;
  iterator pMVar4;
  __mpz_struct _Stack_48;
  uint local_38;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_30;
  
  sVar2 = cont._M_len;
  o = cont._M_array;
  this->_capacity = sVar2;
  if (sVar2 == 0) {
    this->_stack = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    this->_cursor = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    this->_end = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  }
  else {
    uVar3 = sVar2 * 0x20;
    if (uVar3 == 0) {
      pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar3 < 0x21) {
      pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar3 < 0x31) {
      pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar3 < 0x41) {
      pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)::operator_new(uVar3,0x10);
    }
    this->_stack = pMVar1;
    this->_cursor = pMVar1;
    this->_end = pMVar1 + this->_capacity;
    pMVar4 = o + sVar2;
    do {
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&_Stack_48,&o->numeral);
      local_38 = (o->factors)._id;
      local_30 = (o->factors)._ptr;
      pMVar1 = this->_cursor;
      if (pMVar1 == this->_end) {
        expand(this);
        pMVar1 = this->_cursor;
      }
      Kernel::IntegerConstantType::IntegerConstantType
                (&pMVar1->numeral,(IntegerConstantType *)&_Stack_48);
      (pMVar1->factors)._id = local_38;
      (pMVar1->factors)._ptr = local_30;
      this->_cursor = this->_cursor + 1;
      mpz_clear(&_Stack_48);
      o = o + 1;
    } while (o != pMVar4);
  }
  return;
}

Assistant:

Stack(std::initializer_list<C> cont)
   : Stack(cont.size())
  {
    for (auto const& x : cont) {
      push(x);
    }
  }